

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

size_t __thiscall helics::apps::Connector::addTag(Connector *this,string_view tagName)

{
  size_t hash;
  ulong local_28;
  char *local_20;
  size_t local_18;
  
  local_20 = tagName._M_str;
  local_28 = tagName._M_len;
  local_18 = std::_Hash_bytes(local_20,local_28,0xc70f6907);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long_const&,std::basic_string_view<char,std::char_traits<char>>&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->tags,&local_18,&local_28);
  return local_18;
}

Assistant:

std::size_t Connector::addTag(std::string_view tagName)
{
    const std::size_t hash = std::hash<std::string_view>()(tagName);
    tags.emplace(hash, tagName);
    return hash;
}